

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dac_control.c
# Opt level: O2

void daccontrol_start(void *info,UINT32 DataPos,UINT8 LenMode,UINT32 Length)

{
  ulong uVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  
  if ((char)*(byte *)((long)info + 0x7c) < '\0') {
    return;
  }
  uVar1 = (ulong)Length;
  iVar2 = (uint)*(byte *)((long)info + 0x75) * (uint)*(byte *)((long)info + 0x54);
  if (DataPos != 0xffffffff) {
    uVar4 = DataPos + iVar2;
    if (*(uint *)((long)info + 0x60) <= uVar4) {
      uVar4 = *(uint *)((long)info + 0x60);
    }
    *(uint *)((long)info + 0x70) = uVar4;
  }
  switch(LenMode & 0xf) {
  case 0:
    Length = *(uint *)((long)info + 0x78);
    goto LAB_0012219f;
  case 1:
    break;
  case 2:
    Length = (Length * 1000) / *(uint *)((long)info + 0x5c);
    break;
  case 3:
    uVar1 = (ulong)(uint)((iVar2 + *(int *)((long)info + 0x60)) - *(int *)((long)info + 0x70));
    goto LAB_00122191;
  default:
    if ((LenMode & 0xf) != 0xf) {
      *(undefined4 *)((long)info + 0x78) = 0;
      Length = 0;
      goto LAB_0012219f;
    }
LAB_00122191:
    Length = (UINT32)(uVar1 / *(byte *)((long)info + 0x98));
  }
  *(UINT32 *)((long)info + 0x78) = Length;
LAB_0012219f:
  iVar2 = 0;
  bVar3 = LenMode >> 4 & 1;
  *(byte *)((long)info + 0x7d) = bVar3;
  *(UINT32 *)((long)info + 0x90) = Length;
  *(long *)((long)info + 0x88) = 0x100000000 - *(long *)((long)info + 0x80);
  if (bVar3 != 0) {
    iVar2 = (uint)*(byte *)((long)info + 0x98) * (Length - 1);
  }
  *(int *)((long)info + 0x94) = iVar2;
  *(byte *)((long)info + 0x7c) = (LenMode >> 5 & 4 | *(byte *)((long)info + 0x7c) & 0x7a) + 1;
  return;
}

Assistant:

void daccontrol_start(void* info, UINT32 DataPos, UINT8 LenMode, UINT32 Length)
{
	dac_control* chip = (dac_control*)info;
	UINT16 CmdStepBase;
	
	if (chip->Running & 0x80)
		return;
	
	CmdStepBase = chip->CmdSize * chip->StepBase;
	if (DataPos != (UINT32)-1)	// skip setting DataStart, if Pos == -1
	{
		chip->DataStart = DataPos + CmdStepBase;
		if (chip->DataStart > chip->DataLen)	// catch bad value and force silence
			chip->DataStart = chip->DataLen;
	}
	
	switch(LenMode & 0x0F)
	{
	case DCTRL_LMODE_IGNORE:	// Length is already set - ignore
		break;
	case DCTRL_LMODE_CMDS:		// Length = number of commands
		chip->CmdsToSend = Length;
		break;
	case DCTRL_LMODE_MSEC:		// Length = time in msec
		chip->CmdsToSend = 1000 * Length / chip->Frequency;
		break;
	case DCTRL_LMODE_TOEND:		// play until stop-command is received (or data-end is reached)
		chip->CmdsToSend = (chip->DataLen - (chip->DataStart - CmdStepBase)) / chip->DataStep;
		break;
	case DCTRL_LMODE_BYTES:		// raw byte count
		chip->CmdsToSend = Length / chip->DataStep;
		break;
	default:
		chip->CmdsToSend = 0x00;
		break;
	}
	chip->Reverse = (LenMode & 0x10) >> 4;
	
	chip->RemainCmds = chip->CmdsToSend;
	RC_RESET_PRESTEP(&chip->stepCntr);	// first sample is sent with next update
	if (! chip->Reverse)
		chip->RealPos = 0x00;
	else
		chip->RealPos = (chip->CmdsToSend - 1) * chip->DataStep;
	
	chip->Running &= ~0x04;
	chip->Running |= (LenMode & 0x80) ? 0x04 : 0x00;	// set loop mode
	
	chip->Running |= 0x01;	// start
	
	return;
}